

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPUDPv4Transmitter::GetLocalHostName
          (RTPUDPv4Transmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  uint uVar1;
  ulong __n;
  RTPUDPv4Transmitter *pRVar2;
  bool bVar3;
  int iVar4;
  hostent *phVar5;
  long lVar6;
  uint8_t *puVar7;
  size_t sVar8;
  _Self __tmp;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  bool bVar11;
  allocator<char> local_c5;
  int local_c4;
  RTPUDPv4Transmitter *local_c0;
  uint8_t addr [4];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hostnames;
  string hname;
  string hname_1;
  
  if (this->init != true) {
    return -0x5a;
  }
  if (this->created != true) {
    return -0x59;
  }
  if (this->localhostname != (uint8_t *)0x0) goto LAB_001275d1;
  p_Var9 = (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var9 == (_List_node_base *)&this->localIPs) {
    return -0x55;
  }
  hostnames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_c0 = this;
  hostnames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&hostnames;
  hostnames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&hostnames;
  for (; p_Var9 != (_List_node_base *)&this->localIPs; p_Var9 = p_Var9->_M_next) {
    bVar11 = true;
    bVar3 = false;
    while ((bVar11 && (!bVar3))) {
      uVar1 = *(uint *)&p_Var9[1]._M_next;
      addr = (uint8_t  [4])
             (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
      phVar5 = gethostbyaddr(addr,4,2);
      bVar11 = phVar5 != (hostent *)0x0;
      if (bVar11) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&hname,phVar5->h_name,(allocator<char> *)&hname_1);
        p_Var10 = (_List_node_base *)&hostnames;
        while (!bVar3) {
          p_Var10 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var10 == (_List_node_base *)&hostnames) {
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&hostnames,&hname);
            break;
          }
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(p_Var10 + 1),&hname);
        }
        local_c4 = 0;
        while ((!bVar3 && (phVar5->h_aliases[local_c4] != (char *)0x0))) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&hname_1,phVar5->h_aliases[local_c4],&local_c5);
          p_Var10 = (_List_node_base *)&hostnames;
          while (!bVar3) {
            p_Var10 = p_Var10->_M_next;
            if (p_Var10 == (_List_node_base *)&hostnames) {
              std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&hostnames,&hname_1);
              local_c4 = local_c4 + 1;
              break;
            }
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var10 + 1),&hname_1);
          }
          std::__cxx11::string::~string((string *)&hname_1);
        }
        std::__cxx11::string::~string((string *)&hname);
      }
    }
  }
  if (hostnames.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&hostnames) {
LAB_00127541:
    this = local_c0;
    uVar1 = *(uint *)&(local_c0->localIPs).
                      super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
                      super__List_node_base._M_next[1]._M_next;
    snprintf((char *)&hname,0x10,"%d.%d.%d.%d",(ulong)(uVar1 >> 0x18),(ulong)(uVar1 >> 0x10 & 0xff),
             (ulong)(uVar1 >> 8 & 0xff),uVar1 & 0xff);
    sVar8 = strlen((char *)&hname);
    this->localhostnamelength = (long)(int)sVar8;
    puVar7 = (uint8_t *)
             operator_new__((long)(int)sVar8 + 1,
                            (this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0);
    this->localhostname = puVar7;
    if (puVar7 == (uint8_t *)0x0) {
LAB_00127609:
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&hostnames.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
      return -1;
    }
    memcpy(puVar7,&hname,this->localhostnamelength);
    this->localhostname[this->localhostnamelength] = '\0';
  }
  else {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::sort(&hostnames);
    bVar3 = false;
    p_Var9 = (_List_node_base *)&hostnames;
    while (p_Var9 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          !(bool)(p_Var9 == (_List_node_base *)&hostnames | bVar3)) {
      lVar6 = std::__cxx11::string::find((char)(p_Var9 + 1),0x2e);
      pRVar2 = local_c0;
      if (lVar6 != -1) {
        p_Var10 = p_Var9[1]._M_prev;
        local_c0->localhostnamelength = (size_t)p_Var10;
        puVar7 = (uint8_t *)
                 operator_new__((size_t)((long)&p_Var10->_M_next + 1),
                                (local_c0->super_RTPTransmitter).super_RTPMemoryObject.mgr,0);
        pRVar2->localhostname = puVar7;
        if (puVar7 == (uint8_t *)0x0) goto LAB_00127609;
        memcpy(puVar7,p_Var9[1]._M_next,pRVar2->localhostnamelength);
        pRVar2->localhostname[pRVar2->localhostnamelength] = '\0';
        bVar3 = true;
      }
    }
    this = local_c0;
    if (!bVar3) goto LAB_00127541;
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&hostnames.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
LAB_001275d1:
  __n = this->localhostnamelength;
  if (*bufferlength < __n) {
    *bufferlength = __n;
    iVar4 = -0x45;
  }
  else {
    memcpy(buffer,this->localhostname,__n);
    *bufferlength = this->localhostnamelength;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int RTPUDPv4Transmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		if (localIPs.empty())
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV4TRANS_NOLOCALIPS;
		}
		
		std::list<uint32_t>::const_iterator it;
		std::list<std::string> hostnames;
	
		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			bool founddouble = false;
			bool foundentry = true;

			while (!founddouble && foundentry)
			{
				struct hostent *he;
				uint8_t addr[4];
				uint32_t ip = (*it);
		
				addr[0] = (uint8_t)((ip>>24)&0xFF);
				addr[1] = (uint8_t)((ip>>16)&0xFF);
				addr[2] = (uint8_t)((ip>>8)&0xFF);
				addr[3] = (uint8_t)(ip&0xFF);
				he = gethostbyaddr((char *)addr,4,AF_INET);
				if (he != 0)
				{
					std::string hname = std::string(he->h_name);
					std::list<std::string>::const_iterator it;

					for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
						if ((*it) == hname)
							founddouble = true;

					if (!founddouble)
						hostnames.push_back(hname);
					
					int i = 0;
					while (!founddouble && he->h_aliases[i] != 0)
					{
						std::string hname = std::string(he->h_aliases[i]);
					
						for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
							if ((*it) == hname)
								founddouble = true;

						if (!founddouble)
						{
							hostnames.push_back(hname);
							i++;
						}
					}
				}
				else
					foundentry = false;
			}
		}
	
		bool found  = false;
		
		if (!hostnames.empty())	// try to select the most appropriate hostname
		{
			std::list<std::string>::const_iterator it;
		
			hostnames.sort();
			for (it = hostnames.begin() ; !found && it != hostnames.end() ; it++)
			{
				if ((*it).find('.') != std::string::npos)
				{
					found = true;
					localhostnamelength = (*it).length();
					localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
					if (localhostname == 0)
					{
						MAINMUTEX_UNLOCK
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(localhostname,(*it).c_str(),localhostnamelength);
					localhostname[localhostnamelength] = 0;
				}
			}
		}
	
		if (!found) // use an IP address
		{
			uint32_t ip;
			int len;
			char str[16];
			
			it = localIPs.begin();
			ip = (*it);
			
			RTP_SNPRINTF(str,16,"%d.%d.%d.%d",(int)((ip>>24)&0xFF),(int)((ip>>16)&0xFF),(int)((ip>>8)&0xFF),(int)(ip&0xFF));
			len = strlen(str);
	
			localhostnamelength = len;
			localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength + 1];
			if (localhostname == 0)
			{
				MAINMUTEX_UNLOCK
				return ERR_RTP_OUTOFMEM;
			}
			memcpy(localhostname,str,localhostnamelength);
			localhostname[localhostnamelength] = 0;
		}
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}